

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.cpp
# Opt level: O3

void __thiscall
TasOptimization::ParticleSwarmState::ParticleSwarmState
          (ParticleSwarmState *this,int cnum_dimensions,int cnum_particles)

{
  allocator_type local_49 [9];
  value_type local_40;
  vector<double,_std::allocator<double>_> *local_38;
  
  this->positions_initialized = false;
  this->velocities_initialized = false;
  this->best_positions_initialized = false;
  this->cache_initialized = false;
  this->num_dimensions = cnum_dimensions;
  this->num_particles = cnum_particles;
  local_38 = &this->particle_positions;
  std::vector<double,_std::allocator<double>_>::vector
            (local_38,(long)(cnum_particles * cnum_dimensions),(allocator_type *)&local_40);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->particle_velocities,(long)this->num_dimensions * (long)this->num_particles,
             (allocator_type *)&local_40);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->best_particle_positions,
             (long)this->num_dimensions * ((long)this->num_particles + 1),
             (allocator_type *)&local_40);
  local_40 = 1.79769313486232e+308;
  std::vector<double,_std::allocator<double>_>::vector
            (&this->cache_particle_fvals,(long)this->num_particles,&local_40,local_49);
  local_40 = 1.79769313486232e+308;
  std::vector<double,_std::allocator<double>_>::vector
            (&this->cache_best_particle_fvals,(long)this->num_particles + 1,&local_40,local_49);
  local_40 = (value_type)((ulong)local_40 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->cache_particle_inside,(long)this->num_particles,(bool *)&local_40,
             (allocator_type *)local_49);
  local_40 = (value_type)((ulong)local_40 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->cache_best_particle_inside,(long)this->num_particles + 1,(bool *)&local_40,
             (allocator_type *)local_49);
  return;
}

Assistant:

ParticleSwarmState::ParticleSwarmState(int cnum_dimensions, int cnum_particles):
        positions_initialized(false), velocities_initialized(false), best_positions_initialized(false), cache_initialized(false),
        num_dimensions(cnum_dimensions), num_particles(cnum_particles),
        particle_positions(std::vector<double>(num_particles * num_dimensions)),
        particle_velocities(std::vector<double>(num_particles * num_dimensions)),
        best_particle_positions(std::vector<double>((num_particles + 1) * num_dimensions)),
        cache_particle_fvals(std::vector<double>(num_particles, std::numeric_limits<double>::max())),
        cache_best_particle_fvals(std::vector<double>(num_particles + 1, std::numeric_limits<double>::max())),
        cache_particle_inside(std::vector<bool>(num_particles, false)),
        cache_best_particle_inside(std::vector<bool>(num_particles + 1, false)) {}